

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H18_stack.c
# Opt level: O2

int main(void)

{
  uint __line;
  int iVar1;
  double *d;
  char *__assertion;
  bool bVar2;
  double dVar3;
  
  d = (double *)malloc(0x18);
  iVar1 = pop(d);
  if (iVar1 == -1) {
    iVar1 = push(1.0);
    if (iVar1 == 1) {
      iVar1 = push(2.0);
      if (iVar1 == 2) {
        iVar1 = push(3.0);
        if (iVar1 == 3) {
          iVar1 = pop(d);
          if (iVar1 == 2) {
            iVar1 = pop(d + 1);
            if (iVar1 == 1) {
              iVar1 = pop(d + 2);
              if (iVar1 == 0) {
                if ((*d != 3.0) || (NAN(*d))) {
                  __assertion = "*p == 3.0";
                  __line = 0x2d;
                }
                else {
                  dVar3 = d[1];
                  if ((dVar3 != 2.0) || (NAN(dVar3))) {
                    __assertion = "*(p + 1) == 2.0";
                    __line = 0x2e;
                  }
                  else {
                    dVar3 = d[2];
                    if ((dVar3 != 1.0) || (NAN(dVar3))) {
                      __assertion = "*(p + 2) == 1.0";
                      __line = 0x2f;
                    }
                    else {
                      dVar3 = 0.0;
                      iVar1 = 100;
                      while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
                        push(dVar3);
                        dVar3 = dVar3 + 1.0;
                      }
                      iVar1 = push(1.0);
                      if (iVar1 == -1) {
                        return 0;
                      }
                      __assertion = "push(1.0) == -1";
                      __line = 0x35;
                    }
                  }
                }
              }
              else {
                __assertion = "pop(p + 2) == 0";
                __line = 0x2b;
              }
            }
            else {
              __assertion = "pop(p + 1) == 1";
              __line = 0x2a;
            }
          }
          else {
            __assertion = "pop(p) == 2";
            __line = 0x29;
          }
        }
        else {
          __assertion = "push(3.0) == 3";
          __line = 0x27;
        }
      }
      else {
        __assertion = "push(2.0) == 2";
        __line = 0x26;
      }
    }
    else {
      __assertion = "push(1.0) == 1";
      __line = 0x25;
    }
  }
  else {
    __assertion = "pop(p) == -1";
    __line = 0x23;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                ,__line,"int main()");
}

Assistant:

int main() {
  double *p = (double *)malloc(sizeof(double) * 3);

  assert(pop(p) == -1);

  assert(push(1.0) == 1);
  assert(push(2.0) == 2);
  assert(push(3.0) == 3);

  assert(pop(p) == 2);
  assert(pop(p + 1) == 1);
  assert(pop(p + 2) == 0);

  assert(*p == 3.0);
  assert(*(p + 1) == 2.0);
  assert(*(p + 2) == 1.0);

  for (int i = 0; i < STACKSIZE; i++) {
    push((double)i);
  }

  assert(push(1.0) == -1);
}